

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O0

void __thiscall GeometricObject::find_texture(GeometricObject *this,Vector *p,SurfaceData *t)

{
  Vector local_58;
  Vector local_40;
  Texture *local_28;
  Texture *m;
  SurfaceData *t_local;
  Vector *p_local;
  GeometricObject *this_local;
  
  m = (Texture *)t;
  t_local = (SurfaceData *)p;
  p_local = (Vector *)this;
  Grayzer::SurfaceData::operator=(t,&this->def_material);
  (*this->_vptr_GeometricObject[3])(&local_40,this,t_local);
  Vector::operator=((Vector *)(m + 1),&local_40);
  if (this->mapping != (Map *)0x0) {
    (**(code **)(*(long *)this->mapping + 0x10))(&local_58,this->mapping,t_local);
    Vector::operator=((Vector *)&m[1].turb,&local_58);
  }
  for (local_28 = this->material; local_28 != (Texture *)0x0; local_28 = local_28->next) {
    (*local_28->_vptr_Texture[2])(local_28,t_local,m);
  }
  return;
}

Assistant:

void GeometricObject::find_texture(Vector& p, SurfaceData& t)
{
    Texture *m;

    t = def_material;
    t.n = find_normal(p);

    if(mapping) t.map_coord = mapping->apply(p);

    for( m = material; m != 0; m = m->next) m->apply(p,t);
}